

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O1

secplane_t * P_CheckSlopeWalk(AActor *actor,DVector2 *move)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  sector_t *psVar4;
  sector_t *psVar5;
  long lVar6;
  double *pdVar7;
  bool bVar8;
  msecnode_t *pmVar9;
  ulong uVar10;
  secplane_t *psVar11;
  bool bVar12;
  bool bVar13;
  int iVar14;
  secplane_t *psVar15;
  long lVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  
  if (P_CheckSlopeWalk(AActor*,TVector2<double>&)::copyplane == '\0') {
    P_CheckSlopeWalk();
  }
  uVar3 = (actor->flags).Value;
  if ((uVar3 >> 9 & 1) == 0) {
    psVar4 = actor->floorsector;
    dVar1 = (actor->__Pos).X;
    dVar2 = (actor->__Pos).Y;
    psVar5 = actor->Sector;
    dVar18 = 0.0;
    dVar19 = 0.0;
    if (psVar5->PortalGroup != psVar4->PortalGroup) {
      iVar14 = psVar4->PortalGroup * Displacements.size + psVar5->PortalGroup;
      dVar18 = Displacements.data.Array[iVar14].pos.X;
      dVar19 = Displacements.data.Array[iVar14].pos.Y;
    }
    dVar17 = ((psVar4->floorplane).normal.Y * (dVar19 + dVar2) +
             (psVar4->floorplane).normal.X * (dVar18 + dVar1) + (psVar4->floorplane).D) *
             (psVar4->floorplane).negiC;
    psVar15 = &psVar4->floorplane;
    uVar10 = (ulong)(psVar4->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
    if (uVar10 != 0) {
      lVar16 = 0;
      do {
        lVar6 = *(long *)((long)(psVar4->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.
                                Array + lVar16);
        if ((~*(uint *)(lVar6 + 0x58) & 3) == 0) {
          pdVar7 = *(double **)(lVar6 + 0x28);
          dVar20 = *pdVar7;
          dVar22 = pdVar7[1];
          dVar21 = ((dVar19 + dVar2) * dVar22 + (dVar18 + dVar1) * dVar20 + pdVar7[3]) * pdVar7[4];
          if ((dVar17 < dVar21) && (dVar21 <= (actor->__Pos).Z + actor->MaxStepHeight)) {
            P_CheckSlopeWalk::copyplane.normal.Z = pdVar7[2];
            P_CheckSlopeWalk::copyplane.D = pdVar7[3];
            P_CheckSlopeWalk::copyplane.negiC = pdVar7[4];
            P_CheckSlopeWalk::copyplane.normal.X = dVar20;
            P_CheckSlopeWalk::copyplane.normal.Y = dVar22;
            if (P_CheckSlopeWalk::copyplane.normal.Z < 0.0) {
              P_CheckSlopeWalk::copyplane.normal.Z = -P_CheckSlopeWalk::copyplane.normal.Z;
              P_CheckSlopeWalk::copyplane.D = -P_CheckSlopeWalk::copyplane.D;
              P_CheckSlopeWalk::copyplane.normal.X = -dVar20;
              P_CheckSlopeWalk::copyplane.normal.Y = -dVar22;
              P_CheckSlopeWalk::copyplane.negiC = -P_CheckSlopeWalk::copyplane.negiC;
            }
            psVar15 = &P_CheckSlopeWalk::copyplane;
            dVar17 = dVar21;
          }
        }
        lVar16 = lVar16 + 8;
      } while (uVar10 << 3 != lVar16);
    }
    psVar11 = psVar15;
    if (psVar4 != psVar5) {
      uVar10 = (ulong)(psVar5->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
      if (uVar10 == 0) {
        psVar11 = (secplane_t *)0x0;
      }
      else {
        psVar11 = (secplane_t *)0x0;
        lVar16 = 0;
        do {
          lVar6 = *(long *)((long)(psVar5->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.
                                  Array + lVar16);
          if ((~*(uint *)(lVar6 + 0x58) & 3) == 0) {
            pdVar7 = *(double **)(lVar6 + 0x28);
            dVar18 = *pdVar7;
            dVar19 = pdVar7[1];
            dVar20 = (dVar2 * dVar19 + dVar1 * dVar18 + pdVar7[3]) * pdVar7[4];
            if ((dVar17 < dVar20) && (dVar20 <= (actor->__Pos).Z + actor->MaxStepHeight)) {
              P_CheckSlopeWalk::copyplane.normal.Z = pdVar7[2];
              P_CheckSlopeWalk::copyplane.D = pdVar7[3];
              P_CheckSlopeWalk::copyplane.negiC = pdVar7[4];
              P_CheckSlopeWalk::copyplane.normal.X = dVar18;
              P_CheckSlopeWalk::copyplane.normal.Y = dVar19;
              if (P_CheckSlopeWalk::copyplane.normal.Z < 0.0) {
                P_CheckSlopeWalk::copyplane.normal.Z = -P_CheckSlopeWalk::copyplane.normal.Z;
                P_CheckSlopeWalk::copyplane.D = -P_CheckSlopeWalk::copyplane.D;
                P_CheckSlopeWalk::copyplane.normal.X = -dVar18;
                P_CheckSlopeWalk::copyplane.normal.Y = -dVar19;
                P_CheckSlopeWalk::copyplane.negiC = -P_CheckSlopeWalk::copyplane.negiC;
              }
              psVar15 = &P_CheckSlopeWalk::copyplane;
              dVar17 = dVar20;
            }
          }
          lVar16 = lVar16 + 8;
        } while (uVar10 << 3 != lVar16);
      }
    }
    if ((psVar4 == psVar5) || (dVar17 <= actor->floorz + 4.0)) {
      dVar18 = (actor->__Pos).Z;
      if (dVar18 - dVar17 <= 1.0) {
        dVar19 = (psVar15->normal).X;
        dVar20 = (psVar15->normal).Y;
        if ((((dVar19 != 0.0) || (NAN(dVar19))) || (dVar20 != 0.0)) || (NAN(dVar20))) {
          dVar21 = dVar1 + move->X;
          dVar23 = dVar2 + move->Y;
          dVar22 = (psVar15->normal).Z;
          dVar24 = dVar18 * dVar22 + dVar20 * dVar23 + dVar19 * dVar21 + psVar15->D;
          if (0.0 <= dVar24) {
            if (1.52587890625e-05 <= ABS(dVar18 - dVar17)) {
              return (secplane_t *)0x0;
            }
            if (dVar24 <= 0.0) {
              return (secplane_t *)0x0;
            }
            dVar21 = dVar21 + dVar19 * dVar24;
            dVar23 = dVar23 + dVar20 * dVar24;
          }
          else {
            if (dVar22 < 0.707122802734375) {
              if ((uVar3 >> 0xc & 1) != 0) {
                return psVar11;
              }
              if ((0.4714152018229167 < dVar22) &&
                 (pmVar9 = actor->touching_sectorlist, pmVar9 != (msecnode_t *)0x0)) {
                bVar12 = true;
                bVar13 = true;
                do {
                  psVar4 = pmVar9->m_sector;
                  if ((psVar4->floorplane).normal.Z < 0.707122802734375) {
LAB_00512268:
                    bVar8 = true;
                  }
                  else {
                    dVar17 = 0.0;
                    dVar22 = 0.0;
                    if (psVar5->PortalGroup != psVar4->PortalGroup) {
                      iVar14 = psVar4->PortalGroup * Displacements.size + psVar5->PortalGroup;
                      dVar17 = Displacements.data.Array[iVar14].pos.X;
                      dVar22 = Displacements.data.Array[iVar14].pos.Y;
                    }
                    bVar8 = ((dVar22 + dVar2 + move->Y) * (psVar4->floorplane).normal.Y +
                            (dVar17 + dVar1 + move->X) * (psVar4->floorplane).normal.X +
                            (psVar4->floorplane).D) * (psVar4->floorplane).negiC <
                            dVar18 - actor->MaxStepHeight;
                    bVar13 = bVar12;
                    if (bVar8) goto LAB_00512268;
                    bVar13 = false;
                    bVar12 = bVar13;
                  }
                } while ((bVar8) && (pmVar9 = pmVar9->m_tnext, pmVar9 != (msecnode_t *)0x0));
                if (!bVar13) {
                  return psVar11;
                }
              }
              move->Y = dVar20 + dVar20;
              move->X = dVar19 + dVar19;
              (actor->Vel).X = dVar19 + dVar19;
              (actor->Vel).Y = dVar20 + dVar20;
              return psVar11;
            }
            dVar21 = dVar21 - dVar19 * dVar24;
            dVar23 = dVar23 - dVar20 * dVar24;
          }
          move->Y = dVar23 - dVar2;
          move->X = dVar21 - dVar1;
          return psVar11;
        }
      }
    }
  }
  return (secplane_t *)0x0;
}

Assistant:

const secplane_t * P_CheckSlopeWalk(AActor *actor, DVector2 &move)
{
	static secplane_t copyplane;
	if (actor->flags & MF_NOGRAVITY)
	{
		return NULL;
	}

	DVector3 pos = actor->PosRelative(actor->floorsector);
	const secplane_t *plane = &actor->floorsector->floorplane;
	double planezhere = plane->ZatPoint(pos);

	for (auto rover : actor->floorsector->e->XFloor.ffloors)
	{
		if (!(rover->flags & FF_SOLID) || !(rover->flags & FF_EXISTS)) continue;

		double thisplanez = rover->top.plane->ZatPoint(pos);

		if (thisplanez > planezhere && thisplanez <= actor->Z() + actor->MaxStepHeight)
		{
			copyplane = *rover->top.plane;
			if (copyplane.fC() < 0) copyplane.FlipVert();
			plane = &copyplane;
			planezhere = thisplanez;
		}
	}

	if (actor->floorsector != actor->Sector)
	{
		for (auto rover : actor->Sector->e->XFloor.ffloors)
		{
			if (!(rover->flags & FF_SOLID) || !(rover->flags & FF_EXISTS)) continue;

			double thisplanez = rover->top.plane->ZatPoint(actor);

			if (thisplanez > planezhere && thisplanez <= actor->Z() + actor->MaxStepHeight)
			{
				copyplane = *rover->top.plane;
				if (copyplane.fC() < 0) copyplane.FlipVert();
				plane = &copyplane;
				planezhere = thisplanez;
			}
		}
	}

	if (actor->floorsector != actor->Sector)
	{
		// this additional check prevents sliding on sloped dropoffs
		if (planezhere>actor->floorz + 4)
			return NULL;
	}

	if (actor->Z() - planezhere > 1)
	{ // not on floor
		return NULL;
	}

	if (plane->isSlope())
	{
		DVector2 dest;
		double t;

		dest = actor->Pos() + move;
		t = (plane->Normal() | DVector3(dest, actor->Z())) + plane->fD();
		if (t < 0)
		{ // Desired location is behind (below) the plane
			// (i.e. Walking up the plane)
			if (plane->fC() < STEEPSLOPE)
			{ // Can't climb up slopes of ~45 degrees or more
				if (actor->flags & MF_NOCLIP)
				{
					return (actor->floorsector == actor->Sector) ? plane : NULL;
				}
				else
				{
					const msecnode_t *node;
					bool dopush = true;

					if (plane->fC() > STEEPSLOPE * 2 / 3)
					{
						for (node = actor->touching_sectorlist; node; node = node->m_tnext)
						{
							sector_t *sec = node->m_sector;
							if (sec->floorplane.fC() >= STEEPSLOPE)
							{
								DVector3 pos = actor->PosRelative(sec) +move;

								if (sec->floorplane.ZatPoint(pos) >= actor->Z() - actor->MaxStepHeight)
								{
									dopush = false;
									break;
								}
							}
						}
					}
					if (dopush)
					{
						move = plane->Normal() * 2;
						actor->Vel.X = move.X;
						actor->Vel.Y = move.Y;
					}
					return (actor->floorsector == actor->Sector) ? plane : NULL;
				}
			}
			// Slide the desired location along the plane's normal
			// so that it lies on the plane's surface
			dest -= plane->Normal() * t;
			move = dest - actor->Pos().XY();
			return (actor->floorsector == actor->Sector) ? plane : NULL;
		}
		else if (t > 0)
		{ // Desired location is in front of (above) the plane
			if (actor->isAtZ(planezhere))	// it is very important not to be too precise here.
			{ 
				// Actor's current spot is on/in the plane, so walk down it
				// Same principle as walking up, except reversed
				dest += plane->Normal() * t;
				move = dest - actor->Pos().XY();
				return (actor->floorsector == actor->Sector) ? plane : NULL;
			}
		}
	}
	return NULL;
}